

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O3

int Matvec_SparseCSC(SUNMatrix A,N_Vector x,N_Vector y)

{
  void *pvVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  realtype *prVar9;
  realtype *__s;
  long lVar10;
  int iVar11;
  long lVar12;
  
  pvVar1 = A->content;
  plVar2 = *(long **)((long)pvVar1 + 0x38);
  lVar3 = *(long *)((long)pvVar1 + 0x20);
  lVar4 = *(long *)((long)pvVar1 + 0x30);
  iVar11 = 1;
  if (lVar3 != 0 && (lVar4 != 0 && plVar2 != (long *)0x0)) {
    prVar9 = N_VGetArrayPointer(x);
    __s = N_VGetArrayPointer(y);
    if (prVar9 != __s && (__s != (realtype *)0x0 && prVar9 != (realtype *)0x0)) {
      plVar5 = (long *)A->content;
      lVar6 = *plVar5;
      if (0 < lVar6) {
        memset(__s,0,lVar6 << 3);
      }
      lVar6 = plVar5[1];
      if (0 < lVar6) {
        lVar10 = 0;
        lVar12 = *plVar2;
        do {
          lVar7 = plVar2[lVar10 + 1];
          if (lVar12 < lVar7) {
            do {
              lVar8 = *(long *)(lVar4 + lVar12 * 8);
              __s[lVar8] = *(double *)(lVar3 + lVar12 * 8) * prVar9[lVar10] + __s[lVar8];
              lVar12 = lVar12 + 1;
            } while (lVar7 != lVar12);
          }
          lVar10 = lVar10 + 1;
          lVar12 = lVar7;
        } while (lVar10 != lVar6);
      }
      iVar11 = 0;
    }
  }
  return iVar11;
}

Assistant:

int Matvec_SparseCSC(SUNMatrix A, N_Vector x, N_Vector y)
{
  sunindextype i, j;
  sunindextype *Ap, *Ai;
  realtype *Ax, *xd, *yd;

  /* access data from CSC structure (return if failure) */
  Ap = SM_INDEXPTRS_S(A);
  Ai = SM_INDEXVALS_S(A);
  Ax = SM_DATA_S(A);
  if ((Ap == NULL) || (Ai == NULL) || (Ax == NULL))
    return 1;

  /* access vector data (return if failure) */
  xd = N_VGetArrayPointer(x);
  yd = N_VGetArrayPointer(y);
  if ((xd == NULL) || (yd == NULL) || (xd == yd) )
    return 1;

  /* initialize result */
  for (i=0; i<SM_ROWS_S(A); i++)
    yd[i] = 0.0;

  /* iterate through matrix columns */
  for (j=0; j<SM_COLUMNS_S(A); j++) {

    /* iterate down column of A, performing product */
    for (i=Ap[j]; i<Ap[j+1]; i++)
      yd[Ai[i]] += Ax[i]*xd[j];

  }

  return 0;
}